

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

int __thiscall Fl_Input_::copy_cuts(Fl_Input_ *this)

{
  int iVar1;
  
  iVar1 = 0;
  if ((yankcut != 0) && (iVar1 = 0, ((this->super_Fl_Widget).type_ & 7) != 5)) {
    iVar1 = 1;
    Fl::copy((EVP_PKEY_CTX *)undobuffer,(EVP_PKEY_CTX *)(ulong)(uint)yankcut);
  }
  return iVar1;
}

Assistant:

int Fl_Input_::copy_cuts() {
  // put the yank buffer into the X clipboard
  if (!yankcut || input_type()==FL_SECRET_INPUT) return 0;
  Fl::copy(undobuffer, yankcut, 1);
  return 1;
}